

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O1

int PEM_write_bio(BIO *bp,char *name,char *hdr,uchar *data,long len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  uchar *out;
  long lVar6;
  int iVar7;
  long lVar8;
  int len_00;
  ulong uVar9;
  int outl;
  EVP_ENCODE_CTX ctx;
  int local_84;
  size_t local_80;
  char *local_78;
  uchar *local_70;
  
  EVP_EncodeInit((EVP_ENCODE_CTX *)&stack0xffffffffffffff98);
  sVar4 = strlen(name);
  iVar2 = BIO_write(bp,"-----BEGIN ",0xb);
  if (((iVar2 == 0xb) && (iVar2 = BIO_write(bp,name,(int)sVar4), iVar2 == (int)sVar4)) &&
     (iVar2 = BIO_write(bp,"-----\n",6), iVar2 == 6)) {
    local_70 = data;
    sVar5 = strlen(hdr);
    iVar2 = (int)sVar5;
    if (((0 < iVar2) &&
        ((iVar3 = BIO_write(bp,hdr,iVar2), iVar3 != iVar2 ||
         (iVar2 = BIO_write(bp,"\n",1), iVar2 != 1)))) ||
       (out = (uchar *)OPENSSL_malloc(0x2000), out == (uchar *)0x0)) goto LAB_00498859;
    local_80 = sVar4;
    local_78 = name;
    if (len < 1) {
      iVar2 = 0;
    }
    else {
      uVar9 = 0;
      iVar2 = 0;
      do {
        lVar6 = 0x1400;
        if (len < 0x1400) {
          lVar6 = len;
        }
        EVP_EncodeUpdate((EVP_ENCODE_CTX *)&stack0xffffffffffffff98,out,&local_84,local_70 + uVar9,
                         (int)lVar6);
        if ((local_84 != 0) && (iVar3 = BIO_write(bp,out,local_84), iVar3 != local_84))
        goto LAB_0049885b;
        iVar2 = iVar2 + local_84;
        uVar9 = (ulong)(uint)((int)uVar9 + (int)lVar6);
        lVar8 = len - lVar6;
        bVar1 = lVar6 <= len;
        len = lVar8;
      } while (lVar8 != 0 && bVar1);
    }
    EVP_EncodeFinal((EVP_ENCODE_CTX *)&stack0xffffffffffffff98,out,&local_84);
    if ((local_84 < 1) || (iVar3 = BIO_write(bp,out,local_84), iVar3 == local_84)) {
      iVar3 = BIO_write(bp,"-----END ",9);
      iVar7 = 0;
      if ((iVar3 == 9) &&
         ((len_00 = (int)local_80, iVar3 = BIO_write(bp,local_78,len_00), iVar3 == len_00 &&
          (iVar3 = BIO_write(bp,"-----\n",6), iVar3 == 6)))) {
        iVar7 = iVar2 + local_84;
      }
      goto LAB_0049885d;
    }
  }
  else {
LAB_00498859:
    out = (uchar *)0x0;
  }
LAB_0049885b:
  iVar7 = 0;
LAB_0049885d:
  if (iVar7 == 0) {
    ERR_put_error(9,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                  ,0x215);
  }
  OPENSSL_free(out);
  return iVar7;
}

Assistant:

int PEM_write_bio(BIO *bp, const char *name, const char *header,
                  const unsigned char *data, long len) {
  int nlen, n, i, j, outl;
  unsigned char *buf = NULL;
  EVP_ENCODE_CTX ctx;
  int reason = ERR_R_BUF_LIB;
  int retval = 0;

  EVP_EncodeInit(&ctx);
  nlen = strlen(name);

  if ((BIO_write(bp, "-----BEGIN ", 11) != 11) ||
      (BIO_write(bp, name, nlen) != nlen) ||
      (BIO_write(bp, "-----\n", 6) != 6)) {
    goto err;
  }

  i = strlen(header);
  if (i > 0) {
    if ((BIO_write(bp, header, i) != i) || (BIO_write(bp, "\n", 1) != 1)) {
      goto err;
    }
  }

  buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(PEM_BUFSIZE * 8));
  if (buf == NULL) {
    goto err;
  }

  i = j = 0;
  while (len > 0) {
    n = (int)((len > (PEM_BUFSIZE * 5)) ? (PEM_BUFSIZE * 5) : len);
    EVP_EncodeUpdate(&ctx, buf, &outl, &(data[j]), n);
    if ((outl) && (BIO_write(bp, (char *)buf, outl) != outl)) {
      goto err;
    }
    i += outl;
    len -= n;
    j += n;
  }
  EVP_EncodeFinal(&ctx, buf, &outl);
  if ((outl > 0) && (BIO_write(bp, (char *)buf, outl) != outl)) {
    goto err;
  }
  if ((BIO_write(bp, "-----END ", 9) != 9) ||
      (BIO_write(bp, name, nlen) != nlen) ||
      (BIO_write(bp, "-----\n", 6) != 6)) {
    goto err;
  }
  retval = i + outl;

err:
  if (retval == 0) {
    OPENSSL_PUT_ERROR(PEM, reason);
  }
  OPENSSL_free(buf);
  return retval;
}